

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall EOClient::Initialize(EOClient *this)

{
  uint uVar1;
  EOServer *pEVar2;
  double dVar3;
  EOClient *this_local;
  
  this->upload_fh = (FILE *)0x0;
  this->seq_start = 0;
  this->upcoming_seq_start = -1;
  this->seq = 0;
  pEVar2 = server(this);
  uVar1 = World::GeneratePlayerID(pEVar2->world);
  this->id = uVar1;
  this->length = 0;
  this->packet_state = ReadLen1;
  this->state = Uninitialized;
  this->player = (Player *)0x0;
  this->version = 0;
  this->needpong = false;
  this->login_attempts = 0;
  dVar3 = Timer::GetTime();
  this->start = dVar3;
  return;
}

Assistant:

void EOClient::Initialize()
{
	this->upload_fh = 0;
	this->seq_start = 0;
	this->upcoming_seq_start = -1;
	this->seq = 0;
	this->id = this->server()->world->GeneratePlayerID();
	this->length = 0;
	this->packet_state = EOClient::ReadLen1;
	this->state = EOClient::Uninitialized;
	this->player = 0;
	this->version = 0;
	this->needpong = false;
	this->login_attempts = 0;
	this->start = Timer::GetTime();
}